

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O2

void la_miam_core_v1_data_format_json(la_vstring *vstr,void *data)

{
  _Bool _Var1;
  char *val;
  char *key;
  char local_19;
  undefined1 local_18;
  undefined1 local_17;
  char local_16;
  undefined1 local_15;
  undefined1 local_14;
  char local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  if (*(ushort *)((long)data + 0x10) != 0) {
    la_miam_errors_format_json(vstr,(uint)*(ushort *)((long)data + 0x10));
    return;
  }
  la_json_append_int64(vstr,"pdu_len",(ulong)*(uint *)((long)data + 8));
  la_json_append_string(vstr,"aircraft_id",(char *)((long)data + 0x18));
  la_json_append_int64(vstr,"msg_num",(ulong)*(byte *)((long)data + 0x27));
  la_json_append_bool(vstr,"ack_required",*(char *)((long)data + 0x28) == '\x01');
  la_json_append_int64(vstr,"compression",(ulong)*(byte *)((long)data + 0x29));
  la_json_append_int64(vstr,"encoding",(ulong)*(byte *)((long)data + 0x2a));
  la_json_append_int64(vstr,"app_type",(ulong)*(byte *)((long)data + 0x2b));
  if (*(byte *)((long)data + 0x2b) < 3) {
    la_json_object_start(vstr,"acars");
    local_13 = *(char *)((long)data + 0x20);
    local_12 = *(undefined1 *)((long)data + 0x21);
    local_11 = 0;
    la_json_append_string(vstr,"label",&local_13);
    if (1 < (byte)(*(char *)((long)data + 0x2b) - 1U)) goto LAB_00152da7;
    local_16 = *(char *)((long)data + 0x22);
    local_15 = *(undefined1 *)((long)data + 0x23);
    local_14 = 0;
    la_json_append_string(vstr,"sublabel",&local_16);
    if (*(char *)((long)data + 0x2b) != '\x02') goto LAB_00152da7;
    local_19 = *(char *)((long)data + 0x24);
    val = &local_19;
    local_18 = *(undefined1 *)((long)data + 0x25);
    local_17 = 0;
    key = "mfi";
  }
  else {
    if (*(byte *)((long)data + 0x2b) != 3) {
      la_json_object_start(vstr,"unknown_payload_type");
      goto LAB_00152da7;
    }
    la_json_object_start(vstr,"non_acars");
    val = (char *)((long)data + 0x20);
    key = "app_id";
  }
  la_json_append_string(vstr,key,val);
LAB_00152da7:
  la_json_object_start(vstr,"message");
  if (*data != (uint8_t *)0x0) {
    _Var1 = is_printable(*data,*(uint32_t *)((long)data + 0xc));
    if (_Var1) {
      la_json_append_string(vstr,"text",(char *)*data);
    }
    else {
      la_json_append_octet_string(vstr,"octet_string",*data,(ulong)*(uint *)((long)data + 0xc));
    }
  }
  if (*(ushort *)((long)data + 0x12) != 0) {
    la_miam_errors_format_json(vstr,(uint)*(ushort *)((long)data + 0x12) << 0x10);
  }
  la_json_object_end(vstr);
  la_json_object_end(vstr);
  return;
}

Assistant:

static void la_miam_core_v1_data_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);

	la_miam_core_v1_data_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_HDR);
		return;
	}
	la_json_append_int64(vstr, "pdu_len", pdu->pdu_len);
	la_json_append_string(vstr, "aircraft_id", pdu->aircraft_id);
	la_json_append_int64(vstr, "msg_num", pdu->msg_num);
	la_json_append_bool(vstr, "ack_required", pdu->ack_option == 1 ? true : false);
	la_json_append_int64(vstr, "compression", pdu->compression);
	la_json_append_int64(vstr, "encoding", pdu->encoding);
	la_json_append_int64(vstr, "app_type", pdu->app_type);

	switch(pdu->app_type) {
		case LA_MIAM_CORE_V1_APP_ACARS_2CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_4CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_6CHAR:
			la_json_object_start(vstr, "acars");
			la_json_append_string(vstr, "label",
					(char const *)(&((char[]){pdu->app_id[0], pdu->app_id[1], '\0'})));
			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_4CHAR ||
					pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_json_append_string(vstr, "sublabel",
						(char const *)(&((char[]){pdu->app_id[2], pdu->app_id[3], '\0'})));

			}
			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_json_append_string(vstr, "mfi",
						(char const *)(&((char[]){pdu->app_id[4], pdu->app_id[5], '\0'})));
			}
			break;
		case LA_MIAM_CORE_V1_APP_NONACARS_6CHAR:
			la_json_object_start(vstr, "non_acars");
			la_json_append_string(vstr, "app_id", pdu->app_id);
			break;
		default:
			la_json_object_start(vstr, "unknown_payload_type");
			break;
	}
	la_json_object_start(vstr, "message");
	if(pdu->data != NULL) {
		if(is_printable(pdu->data, pdu->data_len)) {
			la_json_append_string(vstr, "text", (char *)pdu->data);
		} else {
			la_json_append_octet_string(vstr, "octet_string",
					(uint8_t *)pdu->data, pdu->data_len);
		}
	}
	if(pdu->err & LA_MIAM_ERR_BODY) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_BODY);
	}
	la_json_object_end(vstr);   // message
	la_json_object_end(vstr);   // acars / non_acars / unknown_payload_type
}